

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::ReadGPSEph(ReadData *this,FILE *file,uchar *HeadBuff)

{
  ushort uVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  unsigned_short *Message;
  size_t sVar6;
  
  iVar4 = 6;
  if ((this->Head).MessageID == 7) {
    lVar5 = (long)(this->Head).MessageLength;
    sVar6 = lVar5 + 4;
    iVar4 = -1;
    if (-5 < lVar5) {
      iVar4 = (int)sVar6;
    }
    Message = (unsigned_short *)operator_new__((long)iVar4);
    sVar6 = fread(Message,sVar6,1,(FILE *)file);
    if (sVar6 == 0) {
      iVar4 = 2;
    }
    else {
      iVar4 = (this->Head).MessageLength;
      bVar3 = CRCCheck(HeadBuff,(uchar *)Message,iVar4,iVar4);
      iVar4 = 3;
      if (bVar3) {
        uVar1 = *Message - 1;
        iVar4 = 4;
        if (uVar1 < 0x21) {
          this->GPSEph[uVar1].PRN = *Message;
          this->GPSEph[uVar1].sys = GPS;
          this->GPSEph[uVar1].HealthStatus = *(int *)(Message + 6);
          this->GPSEph[uVar1].RefTime.Week = *(int *)(Message + 0xc);
          this->GPSEph[uVar1].RefTime.SOW = *(double *)(Message + 0x10);
          dVar2 = *(double *)(Message + 0x1c);
          this->GPSEph[uVar1].deltaN = *(double *)(Message + 0x18);
          this->GPSEph[uVar1].M0 = dVar2;
          dVar2 = *(double *)(Message + 0x14);
          if (dVar2 < 0.0) {
            dVar2 = sqrt(dVar2);
          }
          else {
            dVar2 = SQRT(dVar2);
          }
          this->GPSEph[uVar1].sqrtA = dVar2;
          this->GPSEph[uVar1].ecc = *(double *)(Message + 0x20);
          dVar2 = *(double *)(Message + 0x28);
          this->GPSEph[uVar1].w = *(double *)(Message + 0x24);
          this->GPSEph[uVar1].cuc = dVar2;
          dVar2 = *(double *)(Message + 0x30);
          this->GPSEph[uVar1].cus = *(double *)(Message + 0x2c);
          this->GPSEph[uVar1].crc = dVar2;
          dVar2 = *(double *)(Message + 0x38);
          this->GPSEph[uVar1].crs = *(double *)(Message + 0x34);
          this->GPSEph[uVar1].cic = dVar2;
          dVar2 = *(double *)(Message + 0x40);
          this->GPSEph[uVar1].cis = *(double *)(Message + 0x3c);
          this->GPSEph[uVar1].I0 = dVar2;
          dVar2 = *(double *)(Message + 0x48);
          this->GPSEph[uVar1].I0Rate = *(double *)(Message + 0x44);
          this->GPSEph[uVar1].omegaO = dVar2;
          this->GPSEph[uVar1].omegaORate = *(double *)(Message + 0x4c);
          this->GPSEph[uVar1].iodc = (long)*(int *)(Message + 0x50);
          dVar2 = *(double *)(Message + 0x56);
          this->GPSEph[uVar1].toc = *(double *)(Message + 0x52);
          this->GPSEph[uVar1].tgd = dVar2;
          dVar2 = *(double *)(Message + 0x5e);
          this->GPSEph[uVar1].af0 = *(double *)(Message + 0x5a);
          this->GPSEph[uVar1].af1 = dVar2;
          this->GPSEph[uVar1].af2 = *(double *)(Message + 0x62);
          this->GPSEph[uVar1].URA = *(double *)(Message + 0x6c);
          operator_delete__(Message);
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ReadData::ReadGPSEph(FILE* file, unsigned char* HeadBuff)
{
    if(this->Head.MessageID != 7)
        return CONFLICT_ID;

    char* buff = new char[this->Head.MessageLength + 4];

    if(!fread(buff, this->Head.MessageLength + 4, 1, file))
        return FILE_OR_BUFF_END;

    try
    {
        if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength))
            return CRC_FAILED;

        unsigned short int prn = U2I((unsigned char*)buff, 4) - 1;
        if(prn < 0 || prn > MAXGPSSRN)
            return INVALID_PRN;
        this->GPSEph[prn].PRN = prn + 1;
        this->GPSEph[prn].sys = GPS;

        this->GPSEph[prn].HealthStatus = U2I((unsigned char*)(buff + 12), 4);
        this->GPSEph[prn].RefTime.Week = U2I((unsigned char*)(buff + 24), 4);
        this->GPSEph[prn].RefTime.SOW = C2D(buff + 32, 8);
        this->GPSEph[prn].deltaN = C2D(buff + 48, 8);
        this->GPSEph[prn].M0 = C2D((buff + 56), 8);
        this->GPSEph[prn].sqrtA = sqrt(C2D(buff + 40, 8));
        this->GPSEph[prn].ecc = C2D(buff + 64, 8);
        this->GPSEph[prn].w = C2D(buff + 72, 8);
        this->GPSEph[prn].cuc = C2D(buff + 80, 8);
        this->GPSEph[prn].cus = C2D(buff + 88, 8);
        this->GPSEph[prn].crc = C2D(buff + 96, 8);
        this->GPSEph[prn].crs = C2D(buff + 104, 8);
        this->GPSEph[prn].cic = C2D(buff + 112, 8);
        this->GPSEph[prn].cis = C2D(buff + 120, 8);
        this->GPSEph[prn].I0 = C2D(buff + 128, 8);
        this->GPSEph[prn].I0Rate = C2D(buff + 136, 8);
        this->GPSEph[prn].omegaO = C2D(buff + 144, 8);
        this->GPSEph[prn].omegaORate  = C2D(buff + 152, 8);
        this->GPSEph[prn].iodc = U2I((unsigned char*)buff + 160, 4);
        this->GPSEph[prn].toc = C2D(buff + 164, 8);
        this->GPSEph[prn].tgd = C2D(buff + 172, 8);
        this->GPSEph[prn].af0 = C2D(buff + 180, 8);
        this->GPSEph[prn].af1 = C2D(buff + 188, 8);
        this->GPSEph[prn].af2 = C2D(buff + 196, 8);
        this->GPSEph[prn].URA = C2D(buff + 216, 8);
    }
    catch(...)
    {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;

    return 0;
}